

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::f_formatter<spdlog::details::null_scoped_padder>::format
          (f_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  unsigned_long n;
  null_scoped_padder local_41;
  undefined8 uStack_40;
  null_scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  duration<long,_std::ratio<1L,_1000000L>_> micros;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  f_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  micros.__r = (rep)dest;
  local_30 = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                       ((msg->time).__d.__r);
  uStack_40 = 6;
  null_scoped_padder::null_scoped_padder
            (&local_41,6,&(this->super_flag_formatter).padinfo_,(memory_buf_t *)micros.__r);
  n = CLI::std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_30);
  fmt_helper::pad6<unsigned_long>(n,(memory_buf_t *)micros.__r);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }